

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O1

void gguf_set_val_f64(gguf_context *ctx,char *key,double val)

{
  int iVar1;
  allocator<char> local_41;
  double local_40;
  char *local_38;
  long *local_30 [2];
  long local_20 [2];
  
  local_40 = val;
  local_38 = key;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_30,key,&local_41);
  iVar1 = std::__cxx11::string::compare((char *)local_30);
  if (iVar1 != 0) {
    if (local_30[0] != local_20) {
      operator_delete(local_30[0],local_20[0] + 1);
    }
    gguf_remove_key(ctx,local_38);
    std::vector<gguf_kv,std::allocator<gguf_kv>>::emplace_back<char_const*&,double&>
              ((vector<gguf_kv,std::allocator<gguf_kv>> *)&ctx->kv,&local_38,&local_40);
    return;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]ggml/src/gguf.cpp",0x3a8
             ,"general.alignment must be type u32");
}

Assistant:

void gguf_set_val_f64(struct gguf_context * ctx, const char * key, double val) {
    gguf_check_reserved_keys(key, val);
    gguf_remove_key(ctx, key);
    ctx->kv.emplace_back(key, val);
}